

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

void xmlCatalogFreeLocal(void *catalogs)

{
  xmlCatalogEntryPtr catal;
  void *catalogs_local;
  
  if (xmlCatalogInitialized == 0) {
    xmlInitializeCatalog();
  }
  if (catalogs != (void *)0x0) {
    xmlFreeCatalogEntryList((xmlCatalogEntryPtr)catalogs);
  }
  return;
}

Assistant:

void
xmlCatalogFreeLocal(void *catalogs) {
    xmlCatalogEntryPtr catal;

    if (!xmlCatalogInitialized)
	xmlInitializeCatalog();

    catal = (xmlCatalogEntryPtr) catalogs;
    if (catal != NULL)
	xmlFreeCatalogEntryList(catal);
}